

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

vector<Card_*,_std::allocator<Card_*>_> * __thiscall
Player::getAvailableCards
          (vector<Card_*,_std::allocator<Card_*>_> *__return_storage_ptr__,Player *this,Type color)

{
  Card **ppCVar1;
  Type TVar2;
  Card **__args;
  vector<Card_*,_std::allocator<Card_*>_> available_cards;
  pointer local_48;
  iterator iStack_40;
  pointer local_38;
  
  local_48 = (pointer)0x0;
  iStack_40._M_current = (pointer)0x0;
  local_38 = (pointer)0x0;
  ppCVar1 = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (__args = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
                super__Vector_impl_data._M_start; __args != ppCVar1; __args = __args + 1) {
    TVar2 = Card::getColor(*__args);
    if (TVar2 == color) {
      if (iStack_40._M_current == local_38) {
        std::vector<Card*,std::allocator<Card*>>::_M_realloc_insert<Card*const&>
                  ((vector<Card*,std::allocator<Card*>> *)&local_48,iStack_40,__args);
      }
      else {
        *iStack_40._M_current = *__args;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
    }
  }
  if (local_48 == iStack_40._M_current) {
    std::vector<Card_*,_std::allocator<Card_*>_>::vector(__return_storage_ptr__,&this->_hand);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
    super__Vector_impl_data._M_start = local_48;
    (__return_storage_ptr__->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = iStack_40._M_current;
    (__return_storage_ptr__->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = (pointer)0x0;
    iStack_40._M_current = (pointer)0x0;
    local_38 = (pointer)0x0;
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card *> Player::getAvailableCards(Color::Type color) {
    std::vector<Card *> available_cards;
    copy_if(_hand.begin(), _hand.end(), std::back_inserter(available_cards),
            [color](const Card *card) {
                return card->getColor() == color;
            });
    if (available_cards.empty()) return _hand;
    return available_cards;
}